

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer.cpp
# Opt level: O3

void __thiscall adios2::core::engine::BP5Writer::FlushData(BP5Writer *this,bool isFinal)

{
  Comm *this_00;
  int iVar1;
  ChunkV *this_01;
  BufferV *this_02;
  MallocV *this_03;
  uint64_t uVar2;
  unsigned_long *destination;
  _Alloc_hider _Var3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> RecvBuffer;
  size_t tmp [2];
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_a8;
  uint64_t local_88;
  uint64_t local_80;
  string local_70;
  string local_50;
  
  if ((this->super_BP5Engine).m_Parameters.BufferVType == 0) {
    this_03 = (MallocV *)operator_new(0xa0);
    paVar4 = &local_50.field_2;
    local_50._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"BP5Writer","");
    adios2::format::MallocV::MallocV
              (this_03,&local_50,false,(this->m_BP5Serializer).m_BufferAlign,
               (this->m_BP5Serializer).m_BufferBlockSize,
               (this->super_BP5Engine).m_Parameters.InitialBufferSize,
               (double)(this->super_BP5Engine).m_Parameters.GrowthFactor);
    this_02 = adios2::format::BP5Serializer::ReinitStepData
                        (&this->m_BP5Serializer,(BufferV *)this_03,
                         (bool)((this->super_BP5Engine).m_Parameters.AsyncWrite != 0 |
                               (this->super_BP5Engine).m_Parameters.DirectIO & 1U));
    _Var3._M_p = local_50._M_dataplus._M_p;
  }
  else {
    this_01 = (ChunkV *)operator_new(0xb0);
    paVar4 = &local_70.field_2;
    local_70._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"BP5Writer","");
    adios2::format::ChunkV::ChunkV
              (this_01,&local_70,false,(this->m_BP5Serializer).m_BufferAlign,
               (this->m_BP5Serializer).m_BufferBlockSize,
               (this->super_BP5Engine).m_Parameters.BufferChunkSize);
    this_02 = adios2::format::BP5Serializer::ReinitStepData
                        (&this->m_BP5Serializer,(BufferV *)this_01,
                         (bool)((this->super_BP5Engine).m_Parameters.AsyncWrite != 0 |
                               (this->super_BP5Engine).m_Parameters.DirectIO & 1U));
    _Var3._M_p = local_70._M_dataplus._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var3._M_p != paVar4) {
    operator_delete(_Var3._M_p);
  }
  uVar2 = adios2::format::BufferV::Size(this_02);
  WriteData(this,this_02);
  this->m_ThisTimestepDataSize = this->m_ThisTimestepDataSize + uVar2;
  if (!isFinal) {
    local_88 = this->m_StartDataPos;
    local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (unsigned_long *)0x0;
    local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_00 = &(this->super_Engine).m_Comm;
    local_80 = uVar2;
    iVar1 = helper::Comm::Rank(this_00);
    if (iVar1 == 0) {
      iVar1 = helper::Comm::Size(this_00);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (&local_a8,(long)(iVar1 * 2));
      destination = local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start;
    }
    else {
      destination = (unsigned_long *)0x0;
    }
    helper::Comm::GatherArrays<unsigned_long>(this_00,&local_88,2,destination,0);
    iVar1 = helper::Comm::Rank(this_00);
    if (iVar1 == 0) {
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::push_back(&this->FlushPosSizeInfo,&local_a8);
    }
    if (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
      operator_delete(local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void BP5Writer::FlushData(const bool isFinal)
{
    BufferV *DataBuf;
    if (m_Parameters.BufferVType == (int)BufferVType::MallocVType)
    {
        DataBuf = m_BP5Serializer.ReinitStepData(
            new MallocV("BP5Writer", false, m_BP5Serializer.m_BufferAlign,
                        m_BP5Serializer.m_BufferBlockSize, m_Parameters.InitialBufferSize,
                        m_Parameters.GrowthFactor),
            m_Parameters.AsyncWrite || m_Parameters.DirectIO);
    }
    else
    {
        DataBuf = m_BP5Serializer.ReinitStepData(
            new ChunkV("BP5Writer", false, m_BP5Serializer.m_BufferAlign,
                       m_BP5Serializer.m_BufferBlockSize, m_Parameters.BufferChunkSize),
            m_Parameters.AsyncWrite || m_Parameters.DirectIO);
    }

    auto databufsize = DataBuf->Size();
    WriteData(DataBuf);
    /* DataBuf is deleted in WriteData() */
    DataBuf = nullptr;

    m_ThisTimestepDataSize += databufsize;

    if (!isFinal)
    {
        size_t tmp[2];
        // aggregate start pos and data size to rank 0
        tmp[0] = m_StartDataPos;
        tmp[1] = databufsize;

        std::vector<size_t> RecvBuffer;
        if (m_Comm.Rank() == 0)
        {
            RecvBuffer.resize(m_Comm.Size() * 2);
        }
        m_Comm.GatherArrays(tmp, 2, RecvBuffer.data(), 0);
        if (m_Comm.Rank() == 0)
        {
            FlushPosSizeInfo.push_back(RecvBuffer);
        }
    }
}